

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::CopyPropagateArrays::BuildNewAccessChain
          (CopyPropagateArrays *this,Instruction *insertion_point,MemoryObject *source)

{
  pointer pAVar1;
  uint32_t type_id;
  uint32_t base_ptr_id;
  pointer pAVar2;
  Instruction *pIVar3;
  allocator_type local_71;
  vector<unsigned_int,_std::allocator<unsigned_int>_> access_ids;
  InstructionBuilder builder;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  InstructionBuilder::InstructionBuilder
            (&builder,(this->super_MemPass).super_Pass.context_,insertion_point,
             kAnalysisInstrToBlockMapping|kAnalysisBegin);
  if ((source->access_chain_).
      super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (source->access_chain_).
      super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pIVar3 = source->variable_inst_;
  }
  else {
    MemoryObject::BuildConstants(source);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&access_ids,
               (long)(source->access_chain_).
                     super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(source->access_chain_).
                     super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,&local_71);
    pAVar1 = (source->access_chain_).
             super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar2 = (source->access_chain_).
                  super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start; pAVar2 != pAVar1; pAVar2 = pAVar2 + 1)
    {
      if (pAVar2->is_result_id == false) {
        __assert_fail("entry.is_result_id && \"Constants needs to be built first.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                      ,0xb9,
                      "auto spvtools::opt::CopyPropagateArrays::BuildNewAccessChain(Instruction *, CopyPropagateArrays::MemoryObject *)::(anonymous class)::operator()(const AccessChainEntry &) const"
                     );
      }
      *access_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = (uint)pAVar2->field_1;
      access_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((anon_union_4_2_642eeacd_for_AccessChainEntry_1 *)
                     access_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1);
    }
    type_id = MemoryObject::GetPointerTypeId(source,this);
    base_ptr_id = Instruction::result_id(source->variable_inst_);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &access_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    pIVar3 = InstructionBuilder::AddAccessChain
                       (&builder,type_id,base_ptr_id,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&access_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return pIVar3;
}

Assistant:

Instruction* CopyPropagateArrays::BuildNewAccessChain(
    Instruction* insertion_point,
    CopyPropagateArrays::MemoryObject* source) const {
  InstructionBuilder builder(
      context(), insertion_point,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  if (source->AccessChain().size() == 0) {
    return source->GetVariable();
  }

  source->BuildConstants();
  std::vector<uint32_t> access_ids(source->AccessChain().size());
  std::transform(
      source->AccessChain().cbegin(), source->AccessChain().cend(),
      access_ids.begin(), [](const AccessChainEntry& entry) {
        assert(entry.is_result_id && "Constants needs to be built first.");
        return entry.result_id;
      });

  return builder.AddAccessChain(source->GetPointerTypeId(this),
                                source->GetVariable()->result_id(), access_ids);
}